

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitStringTemplate(ParseNodeStrTemplate *pnodeStrTemplate,ByteCodeGenerator *byteCodeGenerator,
                       FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint32 uVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  ByteCodeWriter *pBVar7;
  ParseNodeBin *pPVar8;
  ParseNodeStr *pPVar9;
  ParseNodePtr pPStack_50;
  RegSlot toStringLocation;
  ParseNode *expressionNode;
  ParseNode *stringNode;
  ParseNode *expressionNodeList;
  bool skippedFirst;
  ParseNode *firstString;
  ParseNode *stringNodeList;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeStrTemplate *pnodeStrTemplate_local;
  
  if (pnodeStrTemplate->pnodeStringLiterals == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x231b,"(pnodeStrTemplate->pnodeStringLiterals)",
                       "pnodeStrTemplate->pnodeStringLiterals");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((pnodeStrTemplate->field_0x2a & 1) == 0) {
    if (pnodeStrTemplate->pnodeSubstitutionExpressions == (ParseNodePtr)0x0) {
      if (pnodeStrTemplate->pnodeStringLiterals->nop == knopList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2324,"(pnodeStrTemplate->pnodeStringLiterals->nop != knopList)",
                           "pnodeStrTemplate->pnodeStringLiterals->nop != knopList");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      FuncInfo::AcquireLoc(funcInfo,&pnodeStrTemplate->super_ParseNode);
      Emit(pnodeStrTemplate->pnodeStringLiterals,byteCodeGenerator,funcInfo,0,false,false);
      if ((pnodeStrTemplate->super_ParseNode).location ==
          pnodeStrTemplate->pnodeStringLiterals->location) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2329,
                           "(pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location)"
                           ,
                           "pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Reg2
                (pBVar7,Ld_A,(pnodeStrTemplate->super_ParseNode).location,
                 pnodeStrTemplate->pnodeStringLiterals->location);
      FuncInfo::ReleaseLoc(funcInfo,pnodeStrTemplate->pnodeStringLiterals);
    }
    else {
      FuncInfo::AcquireLoc(funcInfo,&pnodeStrTemplate->super_ParseNode);
      if (pnodeStrTemplate->pnodeStringLiterals->nop != knopList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2334,"(pnodeStrTemplate->pnodeStringLiterals->nop == knopList)",
                           "First string in the list must be a knopList node.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      firstString = pnodeStrTemplate->pnodeStringLiterals;
      pPVar8 = ParseNode::AsParseNodeBin(firstString);
      bVar2 = false;
      pPVar9 = ParseNode::AsParseNodeStr(pPVar8->pnode1);
      uVar4 = Ident::Cch(pPVar9->pid);
      if (uVar4 == 0) {
        bVar2 = true;
      }
      else {
        pPVar8 = ParseNode::AsParseNodeBin(firstString);
        Emit(pPVar8->pnode1,byteCodeGenerator,funcInfo,0,false,false);
        RVar5 = (pnodeStrTemplate->super_ParseNode).location;
        pPVar8 = ParseNode::AsParseNodeBin(firstString);
        if (RVar5 == pPVar8->pnode1->location) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x2344,
                             "(pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location)"
                             ,
                             "pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
        RVar5 = (pnodeStrTemplate->super_ParseNode).location;
        pPVar8 = ParseNode::AsParseNodeBin(firstString);
        Js::ByteCodeWriter::Reg2(pBVar7,Ld_A,RVar5,pPVar8->pnode1->location);
        pPVar8 = ParseNode::AsParseNodeBin(firstString);
        FuncInfo::ReleaseLoc(funcInfo,pPVar8->pnode1);
      }
      stringNode = pnodeStrTemplate->pnodeSubstitutionExpressions;
      while (firstString->nop == knopList) {
        if (stringNode->nop == knopList) {
          pPVar8 = ParseNode::AsParseNodeBin(stringNode);
          pPStack_50 = pPVar8->pnode1;
          pPVar8 = ParseNode::AsParseNodeBin(stringNode);
          stringNode = pPVar8->pnode2;
        }
        else {
          pPStack_50 = stringNode;
        }
        Emit(pPStack_50,byteCodeGenerator,funcInfo,0,false,false);
        if (bVar2) {
          pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::Reg2
                    (pBVar7,Conv_Str,(pnodeStrTemplate->super_ParseNode).location,
                     pPStack_50->location);
          bVar2 = false;
        }
        else {
          RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
          pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::Reg2(pBVar7,Conv_Str,RVar5,pPStack_50->location);
          pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::Reg3
                    (pBVar7,Add_A,(pnodeStrTemplate->super_ParseNode).location,
                     (pnodeStrTemplate->super_ParseNode).location,RVar5);
          FuncInfo::ReleaseTmpRegister(funcInfo,RVar5);
        }
        FuncInfo::ReleaseLoc(funcInfo,pPStack_50);
        pPVar8 = ParseNode::AsParseNodeBin(firstString);
        firstString = pPVar8->pnode2;
        expressionNode = firstString;
        if (firstString->nop == knopList) {
          pPVar8 = ParseNode::AsParseNodeBin(firstString);
          expressionNode = pPVar8->pnode1;
        }
        pPVar9 = ParseNode::AsParseNodeStr(expressionNode);
        uVar4 = Ident::Cch(pPVar9->pid);
        if (uVar4 != 0) {
          Emit(expressionNode,byteCodeGenerator,funcInfo,0,false,false);
          pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::Reg3
                    (pBVar7,Add_A,(pnodeStrTemplate->super_ParseNode).location,
                     (pnodeStrTemplate->super_ParseNode).location,expressionNode->location);
          FuncInfo::ReleaseLoc(funcInfo,expressionNode);
        }
      }
    }
  }
  return;
}

Assistant:

void EmitStringTemplate(ParseNodeStrTemplate *pnodeStrTemplate, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Assert(pnodeStrTemplate->pnodeStringLiterals);

    // For a tagged string template, we will create the callsite constant object as part of the FunctionBody constants table.
    // We only need to emit code for non-tagged string templates here.
    if (!pnodeStrTemplate->isTaggedTemplate)
    {
        // If we have no substitutions and this is not a tagged template, we can emit just the single cooked string.
        if (pnodeStrTemplate->pnodeSubstitutionExpressions == nullptr)
        {
            Assert(pnodeStrTemplate->pnodeStringLiterals->nop != knopList);

            funcInfo->AcquireLoc(pnodeStrTemplate);
            Emit(pnodeStrTemplate->pnodeStringLiterals, byteCodeGenerator, funcInfo, false);

            Assert(pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location);

            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, pnodeStrTemplate->location, pnodeStrTemplate->pnodeStringLiterals->location);
            funcInfo->ReleaseLoc(pnodeStrTemplate->pnodeStringLiterals);
        }
        else
        {
            // If we have substitutions but no tag function, we can skip the callSite object construction (and also ignore raw strings).
            funcInfo->AcquireLoc(pnodeStrTemplate);

            // First string must be a list node since we have substitutions.
            AssertMsg(pnodeStrTemplate->pnodeStringLiterals->nop == knopList, "First string in the list must be a knopList node.");

            ParseNode* stringNodeList = pnodeStrTemplate->pnodeStringLiterals;

            // Emit the first string and load that into the pnode location.
            // skip loading the string if it is empty
            ParseNode* firstString = stringNodeList->AsParseNodeBin()->pnode1;
            bool skippedFirst = false;
            if (firstString->AsParseNodeStr()->pid->Cch() == 0)
            {
                skippedFirst = true;
            }
            else
            {
                Emit(stringNodeList->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);

                Assert(pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location);

                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, pnodeStrTemplate->location, stringNodeList->AsParseNodeBin()->pnode1->location);
                funcInfo->ReleaseLoc(stringNodeList->AsParseNodeBin()->pnode1);
            }


            ParseNode* expressionNodeList = pnodeStrTemplate->pnodeSubstitutionExpressions;
            ParseNode* stringNode;
            ParseNode* expressionNode;

            // Now append the substitution expressions and remaining string constants via normal add operator
            // We will always have one more string constant than substitution expression
            // `strcon1 ${expr1} strcon2 ${expr2} strcon3` = strcon1 + expr1 + strcon2 + expr2 + strcon3
            //
            // strcon1 --- step 1 (above)
            // expr1   \__ step 2
            // strcon2 /
            // expr2   \__ step 3
            // strcon3 /
            while (stringNodeList->nop == knopList)
            {
                // If the current head of the expression list is a list, fetch the node and walk the list.
                if (expressionNodeList->nop == knopList)
                {
                    expressionNode = expressionNodeList->AsParseNodeBin()->pnode1;
                    expressionNodeList = expressionNodeList->AsParseNodeBin()->pnode2;
                }
                else
                {
                    // This is the last element of the expression list.
                    expressionNode = expressionNodeList;
                }

                // Emit the expression and append it to the string we're building.
                Emit(expressionNode, byteCodeGenerator, funcInfo, false);

                // if this is the first expression AND the initial string was empty write directly to the pnodeStrTemplate location
                if (skippedFirst == true)
                {
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Str, pnodeStrTemplate->location, expressionNode->location);
                    skippedFirst = false;
                }
                else
                {
                    Js::RegSlot toStringLocation = funcInfo->AcquireTmpRegister();
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Str, toStringLocation, expressionNode->location);
                    byteCodeGenerator->Writer()->Reg3(Js::OpCode::Add_A, pnodeStrTemplate->location, pnodeStrTemplate->location, toStringLocation);
                    funcInfo->ReleaseTmpRegister(toStringLocation);
                }

                funcInfo->ReleaseLoc(expressionNode);

                // Move to the next string in the list - we already got ahead of the expressions in the first string literal above.
                stringNodeList = stringNodeList->AsParseNodeBin()->pnode2;

                // If the current head of the string literal list is also a list node, need to fetch the actual string literal node.
                if (stringNodeList->nop == knopList)
                {
                    stringNode = stringNodeList->AsParseNodeBin()->pnode1;
                }
                else
                {
                    // This is the last element of the string literal list.
                    stringNode = stringNodeList;
                }

                // Emit the string node following the previous expression and append it to the string.
                // This is either just some string in the list or it is the last string.
                if (stringNode->AsParseNodeStr()->pid->Cch() != 0)
                {
                    Emit(stringNode, byteCodeGenerator, funcInfo, false);
                    byteCodeGenerator->Writer()->Reg3(Js::OpCode::Add_A, pnodeStrTemplate->location, pnodeStrTemplate->location, stringNode->location);
                    funcInfo->ReleaseLoc(stringNode);
                }
            }
        }
    }
}